

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O1

bool __thiscall
xscript::parser::ast::parse_throw_statement
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent)

{
  bool bVar1;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *parent_00;
  _Alloc_hider _Var2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args_00;
  initializer_list<xscript::tokenizer::token_t> __l;
  _Rb_tree<xscript::tokenizer::token_t,_xscript::tokenizer::token_t,_std::_Identity<xscript::tokenizer::token_t>,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
  local_c8;
  string local_98;
  string local_78;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  string local_48;
  less<xscript::tokenizer::token_t> local_22;
  allocator_type local_21;
  
  parent_00 = ast_node::add_child((parent->_M_t).
                                  super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
                                  .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>.
                                  _M_head_impl,THROW_STATEMENT);
  if ((this->cur_token).type == TK_THROW) {
    next(this);
    bVar1 = parse_expression(this,parent_00,0xf);
    if (bVar1) {
      if ((this->cur_token).type == TK_SEMICOLON) {
        next(this);
        return true;
      }
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"build_O1/src/CMakeFiles/xscript.dir/compiler_depend.ts","");
      local_58._M_len = 0x22;
      local_58._M_str = "\';\' expected after throw statement";
      args_00._M_len = 1;
      args_00._M_array = &local_58;
      append_syntax_error(this,&local_78,0x386,args_00);
      local_98.field_2._M_allocated_capacity = local_78.field_2._M_allocated_capacity;
      _Var2._M_p = local_78._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == &local_78.field_2) {
        return false;
      }
    }
    else {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"build_O1/src/CMakeFiles/xscript.dir/compiler_depend.ts","");
      local_58._M_len = CONCAT44(local_58._M_len._4_4_,0x37);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_58;
      std::
      set<xscript::tokenizer::token_t,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
      ::set((set<xscript::tokenizer::token_t,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
             *)&local_c8,__l,&local_22,&local_21);
      process_failover(this,&local_48,0x382,
                       (set<xscript::tokenizer::token_t,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
                        *)&local_c8,true);
      std::
      _Rb_tree<xscript::tokenizer::token_t,_xscript::tokenizer::token_t,_std::_Identity<xscript::tokenizer::token_t>,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
      ::~_Rb_tree(&local_c8);
      local_98.field_2._M_allocated_capacity = local_48.field_2._M_allocated_capacity;
      _Var2._M_p = local_48._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == &local_48.field_2) {
        return false;
      }
    }
  }
  else {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"build_O1/src/CMakeFiles/xscript.dir/compiler_depend.ts","");
    local_58._M_len = 0x10;
    local_58._M_str = "\'throw\' expected";
    args._M_len = 1;
    args._M_array = &local_58;
    process_failover(this,&local_98,0x37d,args,true);
    _Var2._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) {
      return false;
    }
  }
  operator_delete(_Var2._M_p,local_98.field_2._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool ast::parse_throw_statement(std::unique_ptr<ast_node>& parent) {
    std::unique_ptr<ast_node>& node = parent->add_child(THROW_STATEMENT);

    if (cur_token != tokenizer::TK_THROW) {
        return failover({"'throw' expected"});
    }
    next();

    if (!parse_expression(node)) {
        return failover({tokenizer::TK_SEMICOLON});
    }

    if (cur_token != tokenizer::TK_SEMICOLON) {
        return syntax_error({"';' expected after throw statement"});
    }
    next();

    return true;
}